

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void vReport(TidyDocImpl *doc,Node *element,Node *node,uint code,__va_list_tag *args)

{
  _dispatchTable *p_Var1;
  uint code_00;
  _dispatchTable *p_Var2;
  TidyMessageImpl *message;
  va_list args_copy;
  __va_list_tag local_48;
  
  p_Var2 = dispatchTable;
  if (code != 0x222) {
    do {
      p_Var1 = p_Var2 + 1;
      if (p_Var1->code == 0) {
        return;
      }
      p_Var2 = p_Var2 + 1;
    } while (p_Var1->code != code);
  }
  local_48.reg_save_area = args->reg_save_area;
  local_48.gp_offset = args->gp_offset;
  local_48.fp_offset = args->fp_offset;
  local_48.overflow_arg_area = args->overflow_arg_area;
  code_00 = p_Var2->next;
  message = (*p_Var2->handler)(doc,element,node,code,p_Var2->level,&local_48);
  messageOut(message);
  if (code_00 != 0) {
    local_48.reg_save_area = args->reg_save_area;
    local_48.gp_offset = args->gp_offset;
    local_48.fp_offset = args->fp_offset;
    local_48.overflow_arg_area = args->overflow_arg_area;
    vReport(doc,element,node,code_00,&local_48);
  }
  return;
}

Assistant:

static void vReport(TidyDocImpl* doc, Node *element, Node *node, uint code, va_list args)
{
    int i = 0;
    va_list args_copy;

    while ( dispatchTable[i].code != 0 )
    {
        if ( dispatchTable[i].code == code )
        {
            TidyMessageImpl *message;
            messageFormatter *handler = dispatchTable[i].handler;
            TidyReportLevel level = dispatchTable[i].level;

            va_copy(args_copy, args);
            message = handler( doc, element, node, code, level, args_copy );
            va_end(args_copy);

            messageOut( message );

            if ( dispatchTable[i].next )
            {
                va_copy(args_copy, args);
                vReport(doc, element, node, dispatchTable[i].next, args_copy);
                va_end(args_copy);
            }
            break;
        }
        i++;
    }
}